

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

HRESULT __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SysAllocErrorLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,int32 ichMinLine,BSTR *pbstrLine)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  size_t sVar5;
  ulong uVar6;
  undefined4 *puVar7;
  BSTR pWVar8;
  EncodedCharPtr local_80;
  EncodedCharPtr local_68;
  EncodedCharPtr pEnd;
  size_t sStack_38;
  charcount_t cch;
  size_t cb;
  EncodedCharPtr pStart;
  BSTR *pbstrLine_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSStack_18;
  int32 ichMinLine_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  if (pbstrLine == (BSTR *)0x0) {
    this_local._4_4_ = -0x7fffbffd;
  }
  else {
    if ((-1 < ichMinLine) &&
       (pStart = (EncodedCharPtr)pbstrLine, pbstrLine_local._4_4_ = ichMinLine, pSStack_18 = this,
       sVar5 = AdjustedLength(this), (ulong)(long)ichMinLine <= sVar5)) {
      uVar6 = (ulong)(int)pbstrLine_local._4_4_;
      cVar3 = IchMinLine(this);
      if (uVar6 == cVar3) {
        local_68 = this->m_pchMinLine;
      }
      else {
        local_68 = this->m_pchBase;
        sVar5 = UTF8EncodingPolicyBase<false>::CharacterOffsetToUnitOffset
                          (&this->super_UTF8EncodingPolicyBase<false>,this->m_pchBase,
                           this->m_currentCharacter,this->m_pchLast,pbstrLine_local._4_4_);
        local_68 = local_68 + sVar5;
      }
      cb = (size_t)local_68;
      sStack_38 = 0;
      cVar3 = LineLength(this,local_68,this->m_pchLast,&stack0xffffffffffffffc8);
      if (0x7fffffff < cVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x937,"(cch <= 2147483647L)","cch <= LONG_MAX");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      uVar6 = (ulong)(int)pbstrLine_local._4_4_;
      cVar4 = IchMinLine(this);
      if (uVar6 == cVar4) {
        local_80 = this->m_pchMinLine + sStack_38;
      }
      else {
        local_80 = this->m_pchBase;
        sVar5 = UTF8EncodingPolicyBase<false>::CharacterOffsetToUnitOffset
                          (&this->super_UTF8EncodingPolicyBase<false>,this->m_pchBase,
                           this->m_currentCharacter,this->m_pchLast,cVar3);
        local_80 = local_80 + sVar5;
      }
      pWVar8 = SysAllocStringLen((OLECHAR *)0x0,cVar3);
      *(BSTR *)pStart = pWVar8;
      if (*(long *)pStart == 0) {
        return -0x7ff8fff2;
      }
      UTF8EncodingPolicyBase<false>::ConvertToUnicode
                (&this->super_UTF8EncodingPolicyBase<false>,*(LPOLESTR *)pStart,cVar3,
                 (EncodedCharPtr)cb,local_80);
      return 0;
    }
    this_local._4_4_ = -0x7fff0001;
  }
  return this_local._4_4_;
}

Assistant:

HRESULT Scanner<EncodingPolicy>::SysAllocErrorLine(int32 ichMinLine, __out BSTR* pbstrLine)
{
    if( !pbstrLine )
    {
        return E_POINTER;
    }

    // If we overflow the string, we have a serious problem...
    if (ichMinLine < 0 || static_cast<size_t>(ichMinLine) > AdjustedLength() )
    {
        return E_UNEXPECTED;
    }

    typename EncodingPolicy::EncodedCharPtr pStart = static_cast<size_t>(ichMinLine) == IchMinLine() ? m_pchMinLine : m_pchBase + this->CharacterOffsetToUnitOffset(m_pchBase, m_currentCharacter, m_pchLast, ichMinLine);

    // Determine the length by scanning for the next newline
    size_t cb = 0;
    charcount_t cch = LineLength(pStart, m_pchLast, &cb);
    Assert(cch <= LONG_MAX);

    typename EncodingPolicy::EncodedCharPtr pEnd = static_cast<size_t>(ichMinLine) == IchMinLine() ? m_pchMinLine + cb : m_pchBase + this->CharacterOffsetToUnitOffset(m_pchBase, m_currentCharacter, m_pchLast, cch);

    *pbstrLine = SysAllocStringLen(NULL, cch);
    if (!*pbstrLine)
    {
        return E_OUTOFMEMORY;
    }

    this->ConvertToUnicode(*pbstrLine, cch, pStart, pEnd);
    return S_OK;
}